

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

date_t duckdb::Cast::Operation<short,duckdb::date_t>(short input)

{
  bool bVar1;
  InvalidInputException *this;
  bool unaff_retaddr;
  date_t *in_stack_00000008;
  short in_stack_00000016;
  date_t result;
  short in_stack_000001ae;
  string *in_stack_ffffffffffffffb8;
  int32_t local_4;
  
  bVar1 = TryCast::Operation<short,duckdb::date_t>
                    (in_stack_00000016,in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<short,duckdb::date_t>(in_stack_000001ae);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return (date_t)local_4;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}